

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O3

void Abc_NtkAutoDebug(Abc_Ntk_t *pNtk,_func_int_Abc_Ntk_t_ptr *pFuncError)

{
  long *plVar1;
  ulong uVar2;
  uint uVar3;
  __time_t pObj;
  Abc_Obj_t *pObj_00;
  int iVar4;
  uint uVar5;
  int iVar6;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar7;
  Abc_Obj_t *pNodeTo;
  long lVar8;
  Abc_Ntk_t *pNtk_01;
  ulong uVar9;
  long lVar10;
  timespec ts;
  timespec local_78;
  uint local_64;
  ulong local_60;
  uint local_54;
  long local_50;
  long local_48;
  _func_int_Abc_Ntk_t_ptr *local_40;
  Abc_Obj_t *local_38;
  
  local_40 = pFuncError;
  iVar4 = clock_gettime(3,&local_78);
  if (iVar4 < 0) {
    local_50 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_50 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDebug.c"
                  ,0x38,"void Abc_NtkAutoDebug(Abc_Ntk_t *, int (*)(Abc_Ntk_t *))");
  }
  srand(0x123123);
  pNtk_00 = Abc_NtkDup(pNtk);
  iVar4 = (*local_40)(pNtk_00);
  if (iVar4 == 0) {
    puts("The original network does not cause the bug. Quitting.");
  }
  else {
    local_60 = 1;
    uVar5 = 0;
    pNtk_01 = pNtk_00;
    do {
      iVar4 = clock_gettime(3,&local_78);
      if (iVar4 < 0) {
        local_48 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
        local_48 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
      }
      pVVar7 = pNtk_01->vObjs;
      uVar9 = 0;
      iVar4 = 0;
      local_54 = uVar5;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        iVar4 = 0;
        do {
          plVar1 = (long *)pVVar7->pArray[lVar8];
          if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
            lVar10 = 0;
            do {
              uVar5 = *(uint *)((long)plVar1 + 0x14) & 0xf;
              if (uVar5 == 7) {
                iVar6 = Abc_NodeIsConst(*(Abc_Obj_t **)
                                         (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                         (long)*(int *)(plVar1[4] + lVar10 * 4) * 8));
                if (iVar6 == 0) goto LAB_002aff3d;
              }
              else if ((uVar5 == 3) && (pNtk_01->vPos->nSize != 1)) {
LAB_002aff3d:
                iVar4 = iVar4 + 1;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < *(int *)((long)plVar1 + 0x1c));
            pVVar7 = pNtk_01->vObjs;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar7->nSize);
      }
      uVar3 = iVar4 * 2;
      uVar5 = rand();
      local_60 = (ulong)((uint)local_60 ^ uVar5);
      pNtk_00 = pNtk_01;
      if (0 < iVar4) {
        local_64 = 1;
        if (1 < (int)uVar3) {
          local_64 = uVar3;
        }
        uVar9 = 0;
        do {
          uVar2 = (long)((int)local_60 + (int)uVar9) % (long)(int)uVar3;
          pNtk_00 = Abc_NtkDup(pNtk_01);
          if (pNtk_00->nObjCounts[7] != pNtk_01->nObjCounts[7]) {
            __assert_fail("Abc_NtkNodeNum(pNtk) == Abc_NtkNodeNum(pNtkInit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDebug.c"
                          ,0xba,"Abc_Ntk_t *Abc_NtkAutoDebugModify(Abc_Ntk_t *, int, int)");
          }
          Abc_NtkFindGivenFanin
                    (pNtk_00,(int)((uVar2 & 0xffffffff) >> 0x1f) + (int)uVar2 >> 1,
                     (Abc_Obj_t **)&local_78,&local_38);
          pObj = local_78.tv_sec;
          if (((*(uint *)(local_78.tv_sec + 0x14) & 0xf) == 3) &&
             (iVar4 = Abc_NodeIsConst(local_38), iVar4 != 0)) {
            Abc_NtkDeleteAll_rec((Abc_Obj_t *)pObj);
          }
          else {
            if ((uVar2 & 1) == 0) {
              pNodeTo = Abc_NtkCreateNodeConst0(pNtk_00);
            }
            else {
              pNodeTo = Abc_NtkCreateNodeConst1(pNtk_00);
            }
            pObj_00 = local_38;
            Abc_ObjTransferFanout(local_38,pNodeTo);
            Abc_NtkDeleteAll_rec(pObj_00);
            Abc_NtkSweep(pNtk_00,0);
            Abc_NtkCleanupSeq(pNtk_00,0,0,0);
            Abc_NtkToSop(pNtk_00,-1,1000000000);
            Abc_NtkCycleInitStateSop(pNtk_00,0x32,0);
          }
          Io_WriteBlifLogic(pNtk_01,"bug_temp.blif",1);
          iVar4 = (*local_40)(pNtk_00);
          if (iVar4 != 0) {
            Abc_NtkDelete(pNtk_01);
            goto LAB_002b00c8;
          }
          Abc_NtkDelete(pNtk_00);
          uVar5 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar5;
        } while (local_64 != uVar5);
        uVar9 = (ulong)local_64;
        pNtk_00 = pNtk_01;
      }
LAB_002b00c8:
      uVar5 = local_54;
      iVar4 = 0x994021;
      printf("Iter %6d : Latches = %6d. Nodes = %6d. Steps = %6d. Error step = %3d.  ",
             (ulong)local_54,(ulong)(uint)pNtk_00->nObjCounts[8],(ulong)(uint)pNtk_00->nObjCounts[7]
             ,(ulong)uVar3,uVar9);
      Abc_Print(iVar4,"%s =","Time");
      iVar6 = 3;
      iVar4 = clock_gettime(3,&local_78);
      if (iVar4 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar8 + local_48) / 1000000.0);
      uVar5 = uVar5 + 1;
      pNtk_01 = pNtk_00;
    } while ((uint)uVar9 != uVar3);
    Io_WriteBlifLogic(pNtk_00,"bug_found.blif",1);
    iVar4 = 0x994069;
    printf("Final network written into file \"%s\". ","bug_found.blif");
    Abc_Print(iVar4,"%s =","Total time");
    iVar6 = 3;
    iVar4 = clock_gettime(3,&local_78);
    if (iVar4 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar8 + local_50) / 1000000.0);
  }
  Abc_NtkDelete(pNtk_00);
  return;
}

Assistant:

void Abc_NtkAutoDebug( Abc_Ntk_t * pNtk, int (*pFuncError) (Abc_Ntk_t *) )
{
    Abc_Ntk_t * pNtkMod;
    char * pFileName = "bug_found.blif";
    int i, nSteps, nIter, ModNum, RandNum = 1;
    abctime clk, clkTotal = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
    srand( 0x123123 );
    // create internal copy of the network
    pNtk = Abc_NtkDup(pNtk);
    if ( !(*pFuncError)( pNtk ) )
    {
        printf( "The original network does not cause the bug. Quitting.\n" );
        Abc_NtkDelete( pNtk );
        return;
    }
    // perform incremental modifications
    for ( nIter = 0; ; nIter++ )
    {
        clk = Abc_Clock();
        // count how many ways of modifying the network exists
        nSteps = 2 * Abc_NtkCountFaninsTotal(pNtk);
        // try modifying the network as many times
        RandNum ^= rand();
        for ( i = 0; i < nSteps; i++ )
        {
            // get the shifted number of bug
            ModNum = (i + RandNum) % nSteps;
            // get the modified network
            pNtkMod = Abc_NtkAutoDebugModify( pNtk, ModNum/2, ModNum%2 );
            // write the network
            Io_WriteBlifLogic( pNtk, "bug_temp.blif", 1 );   
            // check if the bug is still there
            if ( (*pFuncError)( pNtkMod ) ) // bug is still there
            {
                Abc_NtkDelete( pNtk );
                pNtk = pNtkMod;
                break;
            }
            else // no bug
                Abc_NtkDelete( pNtkMod );
        }
        printf( "Iter %6d : Latches = %6d. Nodes = %6d. Steps = %6d. Error step = %3d.  ", 
            nIter, Abc_NtkLatchNum(pNtk), Abc_NtkNodeNum(pNtk), nSteps, i );
        ABC_PRT( "Time", Abc_Clock() - clk );
        if ( i == nSteps ) // could not modify it while preserving the bug
            break;
    }
    // write out the final network
    Io_WriteBlifLogic( pNtk, pFileName, 1 );
    printf( "Final network written into file \"%s\". ", pFileName );
    ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    Abc_NtkDelete( pNtk );
}